

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O1

int __thiscall ncnn::SPP::forward(SPP *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int *piVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int k;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  int iVar23;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  int iVar24;
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined1 auVar27 [16];
  allocator_type local_f9;
  undefined1 local_f8 [16];
  void *local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  SPP *local_b8;
  long local_b0;
  void *local_a8;
  void *local_a0;
  undefined1 local_98 [44];
  ulong uStack_6c;
  uint uStack_64;
  size_t local_60;
  Option *local_58;
  Mat *local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  local_b8 = this;
  local_58 = opt;
  Mat::create(top_blob,(int)((ulong)(uint)~(-1 << ((char)this->pyramid_height * '\x02' & 0x1fU)) *
                             0x55555556 >> 0x20),1,2,bottom_blob->elemsize,opt->blob_allocator);
  local_e0 = top_blob->data;
  iVar9 = -100;
  if ((local_e0 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < local_b8->pyramid_height) {
      uVar21 = 0;
      local_50 = bottom_blob;
      do {
        uVar12 = 1 << ((byte)uVar21 & 0x1f);
        uVar19 = bottom_blob->c;
        uVar20._0_4_ = bottom_blob->w;
        uVar20._4_4_ = bottom_blob->h;
        local_f8._8_8_ = 0;
        local_f8._0_8_ = uVar20;
        fStack_bc = 1.0 / (float)(int)uVar12;
        local_c8._0_4_ = fStack_bc * (float)(int)(undefined4)uVar20;
        local_c8._4_4_ = fStack_bc * (float)(int)uVar20._4_4_;
        fStack_c0 = fStack_bc * 0.0;
        fStack_bc = fStack_bc * 0.0;
        fVar22 = ceilf((float)local_c8);
        local_d8 = CONCAT44(extraout_XMM0_Db,fVar22);
        fVar22 = ceilf(local_c8._4_4_);
        local_98._0_8_ = bottom_blob->data;
        piVar2 = bottom_blob->refcount;
        local_98._8_4_ = SUB84(piVar2,0);
        local_98._12_4_ = (undefined4)((ulong)piVar2 >> 0x20);
        local_98._16_8_ = bottom_blob->elemsize;
        local_98._24_4_ = bottom_blob->elempack;
        local_98._32_8_ = bottom_blob->allocator;
        uStack_6c = uVar20;
        local_98._40_4_ = bottom_blob->dims;
        uStack_64 = uVar19;
        local_60 = bottom_blob->cstep;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        auVar27._0_8_ = CONCAT44((int)fVar22,(int)(float)local_d8);
        auVar27._8_4_ = (int)local_d8._4_4_;
        auVar27._12_4_ = (int)extraout_XMM0_Db_00;
        iVar23 = ((int)(float)local_d8 << (int)uVar21) - local_f8._0_4_;
        iVar24 = (int)fVar22 - local_f8._4_4_;
        auVar25._0_4_ = -(uint)(0 < iVar23);
        auVar25._4_4_ = -(uint)(0 < iVar23);
        auVar25._8_4_ = -(uint)(0 < iVar24);
        auVar25._12_4_ = -(uint)(0 < iVar24);
        iVar7 = movmskpd(local_98._8_4_,auVar25);
        iVar9 = local_f8._0_4_;
        uVar26 = auVar27._0_8_;
        local_c8 = (ulong)uVar19;
        if (iVar7 == 0) {
LAB_0014fee8:
          iVar7 = (int)uVar26;
          iVar23 = (int)((ulong)uVar26 >> 0x20);
          uVar19 = iVar23 * iVar7;
          local_d8 = uVar21;
          std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(long)(int)uVar19,&local_f9);
          uVar21 = local_d8;
          if (0 < iVar23) {
            iVar24 = 0;
            iVar13 = 0;
            iVar14 = 0;
            do {
              if (0 < iVar7) {
                lVar16 = 0;
                do {
                  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar14 + lVar16] = iVar13 + (int)lVar16;
                  lVar16 = lVar16 + 1;
                  iVar15 = (int)lVar16;
                } while (iVar7 != iVar15);
                iVar14 = iVar14 + iVar15;
                iVar13 = iVar13 + iVar15;
              }
              iVar13 = iVar13 + (iVar9 - iVar7);
              iVar24 = iVar24 + 1;
            } while (iVar24 != iVar23);
          }
          bVar8 = (byte)local_d8;
          if (local_b8->pooling_type == 0) {
            if (0 < (int)(float)local_c8) {
              local_a0 = (void *)local_98._0_8_;
              local_a8 = (void *)(local_60 * local_98._16_8_);
              uVar20 = (ulong)uVar12;
              if ((int)uVar12 < 2) {
                uVar20 = 1;
              }
              local_b0 = (long)(int)(uVar12 << (bVar8 & 0x1f));
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_f8._8_8_;
              local_f8 = auVar5 << 0x40;
              do {
                if ((float)local_d8 != 4.34403e-44) {
                  pvVar11 = (void *)((long)local_e0 + local_f8._0_8_ * local_b0 * 4);
                  uVar10 = 0;
                  do {
                    lVar16 = (long)(iVar9 * iVar23 * (int)uVar10) * 4 +
                             (long)local_a8 * local_f8._0_8_;
                    uVar17 = 0;
                    do {
                      fVar22 = *(float *)(local_98._0_8_ + uVar17 * (long)iVar7 * 4 + lVar16);
                      if (0 < (int)uVar19) {
                        uVar18 = 0;
                        do {
                          fVar1 = *(float *)(local_98._0_8_ +
                                            (long)_space_ofs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar18] *
                                            4 + uVar17 * (long)iVar7 * 4 + lVar16);
                          if (fVar22 <= fVar1) {
                            fVar22 = fVar1;
                          }
                          uVar18 = uVar18 + 1;
                        } while (uVar19 != uVar18);
                      }
                      *(float *)((long)pvVar11 + uVar17 * 4) = fVar22;
                      uVar17 = uVar17 + 1;
                    } while (uVar17 != uVar20);
                    pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar12 * 4);
                    uVar10 = uVar10 + 1;
                  } while (uVar10 != uVar20);
                }
                uVar10 = local_f8._0_8_ + 1;
                local_f8._0_8_ = uVar10;
              } while (uVar10 != local_c8);
            }
          }
          else if ((local_b8->pooling_type == 1) && (0 < (int)(float)local_c8)) {
            local_a0 = (void *)(local_60 * local_98._16_8_);
            local_a8 = (void *)local_98._0_8_;
            uVar3 = uVar12;
            if ((int)uVar12 < 2) {
              uVar3 = 1;
            }
            local_b0 = (long)(int)(uVar12 << (bVar8 & 0x1f));
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_f8._8_8_;
            local_f8 = auVar4 << 0x40;
            do {
              if ((float)local_d8 != 4.34403e-44) {
                pvVar11 = (void *)((long)local_e0 + local_f8._0_8_ * local_b0 * 4);
                uVar20 = 0;
                do {
                  uVar10 = 0;
                  do {
                    if ((int)uVar19 < 1) {
                      fVar22 = 0.0;
                    }
                    else {
                      fVar22 = 0.0;
                      uVar17 = 0;
                      do {
                        fVar22 = fVar22 + *(float *)(local_98._0_8_ +
                                                    (long)_space_ofs.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar17] *
                                                  4 + uVar10 * (long)iVar7 * 4 +
                                                      (long)(iVar9 * iVar23 * (int)uVar20) * 4 +
                                                      (long)local_a0 * local_f8._0_8_);
                        uVar17 = uVar17 + 1;
                      } while (uVar19 != uVar17);
                    }
                    *(float *)((long)pvVar11 + uVar10 * 4) = fVar22 * (1.0 / (float)(int)uVar19);
                    uVar10 = uVar10 + 1;
                  } while (uVar10 != uVar3);
                  pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar12 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar3);
              }
              uVar20 = local_f8._0_8_ + 1;
              local_f8._0_8_ = uVar20;
            } while (uVar20 != local_c8);
          }
          iVar9 = (int)(float)local_c8 << (bVar8 & 0x1f);
          if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          local_e0 = (void *)((long)local_e0 + (long)(iVar9 << (bVar8 & 0x1f)) * 4);
          bVar6 = true;
          bottom_blob = local_50;
        }
        else {
          iVar7 = (iVar23 - (iVar23 + 1 >> 0x1f)) + 1 >> 1;
          iVar9 = (iVar24 - (iVar24 + 1 >> 0x1f)) + 1 >> 1;
          local_f8 = auVar27;
          copy_make_border(bottom_blob,(Mat *)local_98,iVar9,iVar9,iVar7,iVar7,0,0.0,local_58);
          if (((void *)local_98._0_8_ != (void *)0x0) && ((long)(int)uStack_64 * local_60 != 0)) {
            iVar9 = (int)uStack_6c;
            uVar26 = local_f8._0_8_;
            goto LAB_0014fee8;
          }
          bVar6 = false;
        }
        piVar2 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
              if ((void *)local_98._0_8_ != (void *)0x0) {
                free((void *)local_98._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_98._32_8_)[3])();
            }
          }
        }
        local_98._16_8_ = 0;
        local_98._24_4_ = 0;
        local_98._0_8_ = (void *)0x0;
        local_98._8_4_ = 0;
        local_98._12_4_ = 0;
        stack0xffffffffffffff90 = (undefined1  [16])0x0;
        local_60 = 0;
        if (!bVar6) {
          return -100;
        }
        uVar19 = (int)uVar21 + 1;
        uVar21 = (ulong)uVar19;
      } while ((int)uVar19 < local_b8->pyramid_height);
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int SPP::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;

    // 1 + 4 + 16 + 64 + ... + (2*pyramid_height)^2
    int pyramid_num_bins = ((1 << (pyramid_height * 2)) - 1) / 3;
    top_blob.create(pyramid_num_bins, 1, 2, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* pyramid_ptr = top_blob;

    // all spatial pyramids
    for (int p = 0; p < pyramid_height; p++)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int num_bins = 1 << p;

        int kernel_h = ceil(h / (float)num_bins);
        int stride_h = kernel_h;
        int remainder_h = stride_h * num_bins - h;
        int pad_h = (remainder_h + 1) / 2;

        int kernel_w = ceil(w / (float)num_bins);
        int stride_w = kernel_w;
        int remainder_w = stride_w * num_bins - w;
        int pad_w = (remainder_w + 1) / 2;

        // max value in NxN window
        // avg value in NxN window

        int outw = num_bins;
        int outh = num_bins;

        Mat bottom_blob_bordered = bottom_blob;
        if (pad_h > 0 || pad_w > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt);
            if (bottom_blob_bordered.empty())
                return -100;

            w = bottom_blob_bordered.w;
            h = bottom_blob_bordered.h;
        }

        const int maxk = kernel_h * kernel_w;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m(w, h, bottom_blob_bordered.channel(q));
                float* outptr = pyramid_ptr + outh * outw * q;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float max = sptr[0];

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            max = std::max(max, val);
                        }

                        outptr[j] = max;
                    }

                    outptr += outw;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m(w, h, bottom_blob_bordered.channel(q));
                float* outptr = pyramid_ptr + outh * outw * q;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }

        pyramid_ptr += channels * outh * outw;
    }

    return 0;
}